

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

bool __thiscall Player::travel(Player *this,string *direction)

{
  RoomID *__k;
  Map *this_00;
  iterator iVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  long *extraout_RAX;
  long *plVar5;
  undefined8 uVar6;
  char *pcVar7;
  __hashtable *__h;
  long *plStack_50;
  long lStack_48;
  long alStack_40 [2];
  Player *pPStack_30;
  
  this_00 = &this->map;
  __k = &this->currentLocation;
  pPStack_30 = (Player *)0x10b6f1;
  iVar1 = std::
          _Hashtable<int,_std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>,_std::allocator<std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<int,_std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>,_std::allocator<std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this_00,__k);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    pPStack_30 = (Player *)0x10b706;
    iVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(*(long *)((long)iVar1.
                                       super__Node_iterator_base<std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>,_false>
                                       ._M_cur + 0x10) + 0x60),direction);
    pPStack_30 = (Player *)0x10b714;
    iVar1 = std::
            _Hashtable<int,_std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>,_std::allocator<std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<int,_std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>,_std::allocator<std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)this_00,__k);
    if (iVar1.
        super__Node_iterator_base<std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      if (iVar2.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
          ._M_cur != (__node_type *)0x0) {
        pPStack_30 = (Player *)0x10b729;
        iVar1 = std::
                _Hashtable<int,_std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>,_std::allocator<std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<int,_std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>,_std::allocator<std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)this_00,__k);
        if (iVar1.
            super__Node_iterator_base<std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>,_false>
            ._M_cur == (__node_type *)0x0) goto LAB_0010b75b;
        pPStack_30 = (Player *)0x10b73e;
        pmVar3 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)(*(long *)((long)iVar1.
                                                  super__Node_iterator_base<std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>,_false>
                                                  ._M_cur + 0x10) + 0x60),direction);
        this->currentLocation = *pmVar3;
        pPStack_30 = (Player *)0x10b74b;
        look(this);
      }
      return iVar2.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
             ._M_cur != (__node_type *)0x0;
    }
  }
LAB_0010b75b:
  pcVar7 = "_Map_base::at";
  pPStack_30 = (Player *)0x10b767;
  std::__throw_out_of_range("_Map_base::at");
  pPStack_30 = this;
  iVar1 = std::
          _Hashtable<int,_std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>,_std::allocator<std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<int,_std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>,_std::allocator<std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(pcVar7 + 0x88),(key_type *)(pcVar7 + 0x30));
  if (iVar1.
      super__Node_iterator_base<std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    (**(code **)**(undefined8 **)
                  ((long)iVar1.
                         super__Node_iterator_base<std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>,_false>
                         ._M_cur + 0x10))(&plStack_50);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)plStack_50,lStack_48);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    plVar5 = alStack_40;
    if (plStack_50 != plVar5) {
      operator_delete(plStack_50,alStack_40[0] + 1);
      plVar5 = extraout_RAX;
    }
    return SUB81(plVar5,0);
  }
  uVar6 = std::__throw_out_of_range("_Map_base::at");
  if (plStack_50 != alStack_40) {
    operator_delete(plStack_50,alStack_40[0] + 1);
  }
  _Unwind_Resume(uVar6);
}

Assistant:

bool Player::travel(std::string direction)
{
  if (map.rooms.at(currentLocation)->exits.find(direction) == map.rooms.at(currentLocation)->exits.end())
    return false;
  currentLocation = map.rooms.at(currentLocation)->exits[direction];
  look();
  return true;
}